

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall Counter64::fromBuffer(Counter64 *this,uint8_t *buf,size_t max_len)

{
  int local_3c;
  byte *pbStack_38;
  int tempLength;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  Counter64 *this_local;
  
  this_local._4_4_ = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < this_local._4_4_) {
    local_3c = (this->super_BER_CONTAINER)._length;
    this->_value = 0;
    pbStack_38 = buf + this_local._4_4_;
    for (; 0 < local_3c; local_3c = local_3c + -1) {
      this->_value = this->_value << 8;
      this->_value = this->_value | (ulong)*pbStack_38;
      pbStack_38 = pbStack_38 + 1;
    }
    this_local._4_4_ = (this->super_BER_CONTAINER)._length + 2;
  }
  return this_local._4_4_;
}

Assistant:

int Counter64::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    int tempLength = _length;
    _value = 0;
    while(tempLength > 0){
        _value = _value << 8U;
        _value = _value | *ptr++;
        tempLength--;
    }
    return _length + 2;
}